

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

MemRefOpnd * __thiscall IR::MemRefOpnd::CopyInternal(MemRefOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  MemRefOpnd *pMVar4;
  MemRefOpnd *newOpnd;
  Func *func_local;
  MemRefOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindMemRef) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xb62,"(m_kind == OpndKindMemRef)","m_kind == OpndKindMemRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pMVar4 = New(this->m_memLoc,(this->super_Opnd).m_type,func,AddrOpndKindDynamicMisc);
  (pMVar4->super_Opnd).m_valueType.field_0 = (this->super_Opnd).m_valueType.field_0;
  pMVar4->m_memLoc = this->m_memLoc;
  pMVar4->m_addrKind = this->m_addrKind;
  return pMVar4;
}

Assistant:

MemRefOpnd *
MemRefOpnd::CopyInternal(Func *func)
{
    Assert(m_kind == OpndKindMemRef);
    MemRefOpnd * newOpnd;

    newOpnd = MemRefOpnd::New(m_memLoc, m_type, func);

    newOpnd->m_valueType = m_valueType;
    newOpnd->m_memLoc = m_memLoc;
#if DBG_DUMP
    newOpnd->m_addrKind = m_addrKind;
#endif
    return newOpnd;
}